

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

int Wlc_NtkPdrAbs(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  int iVar1;
  Wla_Man_t *pWla;
  
  pWla = Wla_ManStart(p,pPars);
  iVar1 = Wla_ManSolve(pWla,pPars);
  Wla_ManStop(pWla);
  return iVar1;
}

Assistant:

int Wlc_NtkPdrAbs( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    Wla_Man_t * pWla = NULL;
    
    int RetValue = -1;

    pWla = Wla_ManStart( p, pPars );

    RetValue = Wla_ManSolve( pWla, pPars );

    Wla_ManStop( pWla );
    
    return RetValue;
}